

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

bool cs_impl::compare_if<std::pair<cs_impl::any,_cs_impl::any>,_true>::compare
               (pair<cs_impl::any,_cs_impl::any> *a,pair<cs_impl::any,_cs_impl::any> *b)

{
  proxy *ppVar1;
  proxy *ppVar2;
  int iVar3;
  
  ppVar1 = (a->first).mDat;
  ppVar2 = (b->first).mDat;
  if (ppVar2 == (proxy *)0x0 || ppVar1 == (proxy *)0x0) {
    if (ppVar1 == (proxy *)0x0 && ppVar2 == (proxy *)0x0) {
LAB_00164c6f:
      ppVar1 = (a->second).mDat;
      ppVar2 = (b->second).mDat;
      if (ppVar2 == (proxy *)0x0 || ppVar1 == (proxy *)0x0) {
        return ppVar1 == (proxy *)0x0 && ppVar2 == (proxy *)0x0;
      }
      iVar3 = (*ppVar1->data->_vptr_baseHolder[4])(ppVar1->data,ppVar2->data);
      return SUB41(iVar3,0);
    }
  }
  else {
    iVar3 = (*ppVar1->data->_vptr_baseHolder[4])(ppVar1->data,ppVar2->data);
    if ((char)iVar3 != '\0') goto LAB_00164c6f;
  }
  return false;
}

Assistant:

static bool compare(const T &a, const T &b)
		{
			return a == b;
		}